

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O1

int cubeb_stream_init(cubeb *context,cubeb_stream **stream,char *stream_name,
                     cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                     cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                     uint latency,cubeb_data_callback data_callback,
                     cubeb_state_callback state_callback,void *user_ptr)

{
  undefined4 in_EAX;
  int iVar1;
  int extraout_EAX;
  cubeb_stream_params *pcVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  
  auVar7._0_4_ = -(uint)(context == (cubeb *)0x0);
  auVar7._4_4_ = -(uint)(stream == (cubeb_stream **)0x0);
  auVar7._8_4_ = -(uint)(data_callback == (cubeb_data_callback)0x0);
  auVar7._12_4_ = -(uint)(state_callback == (cubeb_state_callback)0x0);
  iVar1 = movmskps(in_EAX,auVar7);
  iVar3 = -3;
  if (iVar1 == 0) {
    if (input_stream_params == (cubeb_stream_params *)0x0 &&
        output_stream_params == (cubeb_stream_params *)0x0) {
      cubeb_stream_init_cold_1();
      if (context != (cubeb *)0x0) {
        iVar1 = (**(code **)(context->ops->init + 0x48))();
        return iVar1;
      }
      return extraout_EAX;
    }
    if ((((output_stream_params == (cubeb_stream_params *)0x0) ||
         ((iVar3 = -2, 0xfffd15e6 < output_stream_params->rate - 0x2ee01 &&
          (0xffffff00 < output_stream_params->channels - 0x100)))) &&
        ((input_stream_params == (cubeb_stream_params *)0x0 ||
         ((iVar3 = -2, 0xfffd15e6 < input_stream_params->rate - 0x2ee01 &&
          (0xffffff00 < input_stream_params->channels - 0x100)))))) &&
       ((input_stream_params == (cubeb_stream_params *)0x0 ||
         output_stream_params == (cubeb_stream_params *)0x0 ||
        ((iVar3 = -2, input_stream_params->rate == output_stream_params->rate &&
         (input_stream_params->format == output_stream_params->format)))))) {
      pcVar2 = output_stream_params;
      if (input_stream_params != (cubeb_stream_params *)0x0) {
        pcVar2 = input_stream_params;
      }
      iVar3 = (uint)(pcVar2->format < 4) * 2 + -2;
    }
    if (iVar3 == 0) {
      bVar6 = latency - 1 < 96000;
      if (bVar6) {
        iVar3 = (*context->ops->stream_init)
                          (context,stream,stream_name,input_device,input_stream_params,output_device
                           ,output_stream_params,latency,data_callback,state_callback,user_ptr);
        if (((iVar3 == -2) && (g_cubeb_log_callback != (cubeb_log_callback)0x0)) &&
           (g_cubeb_log_level != CUBEB_LOG_DISABLED)) {
          uVar5 = 0;
          uVar4 = 0;
          if (output_stream_params != (cubeb_stream_params *)0x0) {
            uVar4 = (ulong)(output_stream_params->format != CUBEB_SAMPLE_S16LE);
          }
          if (input_stream_params != (cubeb_stream_params *)0x0) {
            uVar5 = (ulong)(input_stream_params->format != CUBEB_SAMPLE_S16LE);
          }
          (*g_cubeb_log_callback)
                    ("%s:%d: Invalid format, %p %p %d %d\n","cubeb.c",0x172,output_stream_params,
                     input_stream_params,uVar4,uVar5);
        }
      }
      else {
        iVar3 = (uint)bVar6 * 3 + -3;
      }
    }
  }
  return iVar3;
}

Assistant:

int
cubeb_stream_init(cubeb * context, cubeb_stream ** stream, char const * stream_name,
                  cubeb_devid input_device,
                  cubeb_stream_params * input_stream_params,
                  cubeb_devid output_device,
                  cubeb_stream_params * output_stream_params,
                  unsigned int latency,
                  cubeb_data_callback data_callback,
                  cubeb_state_callback state_callback,
                  void * user_ptr)
{
  int r;

  if (!context || !stream || !data_callback || !state_callback) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

  if ((r = validate_stream_params(input_stream_params, output_stream_params)) != CUBEB_OK ||
      (r = validate_latency(latency)) != CUBEB_OK) {
    return r;
  }

  r = context->ops->stream_init(context, stream, stream_name,
                                input_device,
                                input_stream_params,
                                output_device,
                                output_stream_params,
                                latency,
                                data_callback,
                                state_callback,
                                user_ptr);

  if (r == CUBEB_ERROR_INVALID_FORMAT) {
    LOG("Invalid format, %p %p %d %d",
        output_stream_params, input_stream_params,
        output_stream_params && output_stream_params->format,
        input_stream_params && input_stream_params->format);
  }

  return r;
}